

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall ScriptOperator_operator_2_Test::TestBody(ScriptOperator_operator_2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70 [3];
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  ScriptOperator script_op;
  ScriptOperator_operator_2_Test *this_local;
  
  cfd::core::ScriptOperator::ScriptOperator
            ((ScriptOperator *)&gtest_ar_.message_,
             (ScriptOperator *)cfd::core::ScriptOperator::OP_ROLL);
  bVar1 = cfd::core::ScriptOperator::operator==
                    ((ScriptOperator *)&gtest_ar_.message_,
                     (ScriptOperator *)cfd::core::ScriptOperator::OP_WITHIN);
  local_51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"script_op == ScriptOperator::OP_WITHIN","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_a9 = cfd::core::ScriptOperator::operator==
                       ((ScriptOperator *)&gtest_ar_.message_,
                        (ScriptOperator *)cfd::core::ScriptOperator::OP_ROLL);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_a8,
               (AssertionResult *)"script_op == ScriptOperator::OP_ROLL","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  bVar1 = cfd::core::ScriptOperator::IsPushOperator((ScriptOperator *)&gtest_ar_.message_);
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_f0,(AssertionResult *)"script_op.IsPushOperator()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptOperator::~ScriptOperator((ScriptOperator *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ScriptOperator, operator_2) {
  ScriptOperator script_op(ScriptOperator::OP_ROLL);

  EXPECT_FALSE(script_op == ScriptOperator::OP_WITHIN);
  EXPECT_TRUE(script_op == ScriptOperator::OP_ROLL);
  EXPECT_FALSE(script_op.IsPushOperator());
}